

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int SendDataRequestSeanet(SEANET *pSeanet)

{
  int iVar1;
  uchar reqbuf [18];
  
  builtin_memcpy(reqbuf,"@000C\f",7);
  reqbuf[7] = 0xff;
  reqbuf[8] = '\x02';
  reqbuf[9] = '\a';
  reqbuf[10] = '\x19';
  reqbuf[0xb] = 0x80;
  reqbuf[0xc] = '\x02';
  reqbuf[0xd] = '\0';
  reqbuf[0xe] = '\0';
  reqbuf[0xf] = '\0';
  reqbuf[0x10] = '\0';
  reqbuf[0x11] = '\n';
  iVar1 = WriteAllRS232Port(&pSeanet->RS232Port,reqbuf,0x12);
  if (iVar1 != 0) {
    puts("Error writing data to a Seanet. ");
  }
  return (uint)(iVar1 != 0);
}

Assistant:

inline int SendDataRequestSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','C',0x0C,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x07,mtSendData,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,0x00,0x00,0x00,0x00,MESSAGE_TERMINATOR_SEANET};

	// Send mtSendData message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}